

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33ab2::
ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  initializer_list<int> absent_keys;
  undefined1 local_140 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_38;
  
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_140,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_140,1,v,false);
  v_00._M_extent._M_extent_value = 3;
  v_00._M_ptr = (pointer)&unodb::test::test_value_3;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_140,3,v_00,false);
  v_01._M_extent._M_extent_value = 4;
  v_01._M_ptr = (pointer)&unodb::test::test_value_4;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_140,0xff0001,v_01,false);
  local_38._M_elems[0] = 2;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,(inode_type_counter_array *)&local_38);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,1);
  v_02._M_extent._M_extent_value = 2;
  v_02._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_140,0xff0101,v_02,false);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140);
  local_38._M_elems[0] = 0xff000000ff0100;
  local_38._M_elems[1] = CONCAT44(local_38._M_elems[1]._4_4_,2);
  absent_keys._M_len = 3;
  absent_keys._M_array = (iterator)&local_38;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,absent_keys);
  local_38._M_elems[0] = 4;
  local_38._M_elems[1] = 3;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  local_38._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,&local_38);
  local_38._M_elems[0] = 3;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,(inode_type_counter_array *)&local_38);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_140,1);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)local_140);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, DbInsertNodeRecursion) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(3, unodb::test::test_values[2]);
  // Insert a value that does not share full prefix with the current Node4
  verifier.insert(0xFF0001, unodb::test::test_values[3]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_growing_inodes({2, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS

  // Then insert a value that shares full prefix with the above node and will
  // ask for a recursive insertion there
  verifier.insert(0xFF0101, unodb::test::test_values[1]);

  verifier.check_present_values();
  verifier.check_absent_keys({0xFF0100, 0xFF0000, 2});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({4, 3, 0, 0, 0});
  verifier.assert_growing_inodes({3, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
}